

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-path.c
# Opt level: O1

void clone_traverse_func(void *closure,plutovg_path_command_t command,plutovg_point_t *points,
                        int npoints)

{
  float fVar1;
  float fVar2;
  plutovg_path_element_t *ppVar3;
  
  switch(command) {
  case PLUTOVG_PATH_COMMAND_MOVE_TO:
    fVar1 = points->x;
    fVar2 = points->y;
    ppVar3 = plutovg_path_add_command((plutovg_path_t *)closure,PLUTOVG_PATH_COMMAND_MOVE_TO,1);
    (ppVar3->header).command = (plutovg_path_command_t)fVar1;
    (ppVar3->header).length = (int)fVar2;
    *(float *)((long)closure + 0x10) = fVar1;
    *(float *)((long)closure + 0x14) = fVar2;
    *(int *)((long)closure + 8) = *(int *)((long)closure + 8) + 1;
    break;
  case PLUTOVG_PATH_COMMAND_LINE_TO:
    plutovg_path_line_to((plutovg_path_t *)closure,points->x,points->y);
    return;
  case PLUTOVG_PATH_COMMAND_CUBIC_TO:
    plutovg_path_cubic_to
              ((plutovg_path_t *)closure,points->x,points->y,points[1].x,points[1].y,points[2].x,
               points[2].y);
    return;
  case PLUTOVG_PATH_COMMAND_CLOSE:
    if (*(int *)((long)closure + 0x20) != 0) {
      ppVar3 = plutovg_path_add_command((plutovg_path_t *)closure,PLUTOVG_PATH_COMMAND_CLOSE,1);
      *ppVar3 = *(plutovg_path_element_t *)((long)closure + 0x10);
    }
  }
  return;
}

Assistant:

static void clone_traverse_func(void* closure, plutovg_path_command_t command, const plutovg_point_t* points, int npoints)
{
    plutovg_path_t* path = (plutovg_path_t*)(closure);
    switch(command) {
    case PLUTOVG_PATH_COMMAND_MOVE_TO:
        plutovg_path_move_to(path, points[0].x, points[0].y);
        break;
    case PLUTOVG_PATH_COMMAND_LINE_TO:
        plutovg_path_line_to(path, points[0].x, points[0].y);
        break;
    case PLUTOVG_PATH_COMMAND_CUBIC_TO:
        plutovg_path_cubic_to(path, points[0].x, points[0].y, points[1].x, points[1].y, points[2].x, points[2].y);
        break;
    case PLUTOVG_PATH_COMMAND_CLOSE:
        plutovg_path_close(path);
        break;
    }
}